

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O1

void setpath(lua_State *L,char *fieldname,char *envname,char *def,int noenv)

{
  char *pcVar1;
  
  pcVar1 = getenv(envname);
  if (noenv == 0 && pcVar1 != (char *)0x0) {
    pcVar1 = luaL_gsub(L,pcVar1,";;",";\x01;");
    luaL_gsub(L,pcVar1,"\x01",def);
    lua_remove(L,-2);
  }
  else {
    lua_pushstring(L,def);
  }
  lua_setfield(L,-2,fieldname);
  return;
}

Assistant:

static void setpath(lua_State *L, const char *fieldname, const char *envname,
		    const char *def, int noenv)
{
#if LJ_TARGET_CONSOLE
  const char *path = NULL;
  UNUSED(envname);
#else
  const char *path = getenv(envname);
#endif
  if (path == NULL || noenv) {
    lua_pushstring(L, def);
  } else {
    path = luaL_gsub(L, path, LUA_PATHSEP LUA_PATHSEP,
			      LUA_PATHSEP AUXMARK LUA_PATHSEP);
    luaL_gsub(L, path, AUXMARK, def);
    lua_remove(L, -2);
  }
  setprogdir(L);
  lua_setfield(L, -2, fieldname);
}